

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator_node.cpp
# Opt level: O0

void __thiscall
OperatorNode::Act(OperatorNode *this,stack<double,_std::deque<double,_std::allocator<double>_>_> *s)

{
  uint uVar1;
  uint uVar2;
  reference __x;
  value_type local_50;
  double res;
  uint local_34;
  undefined1 local_30 [4];
  int i;
  vector<double,_std::allocator<double>_> args;
  stack<double,_std::deque<double,_std::allocator<double>_>_> *s_local;
  OperatorNode *this_local;
  
  args.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)s;
  memset(local_30,0,0x18);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_30);
  local_34 = 0;
  while( true ) {
    uVar1 = local_34;
    uVar2 = (*this->operation_->_vptr_IOperation[2])();
    if (uVar2 <= uVar1) break;
    __x = std::stack<double,_std::deque<double,_std::allocator<double>_>_>::top
                    ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)
                     args.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)local_30,__x);
    std::stack<double,_std::deque<double,_std::allocator<double>_>_>::pop
              ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)
               args.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    local_34 = local_34 + 1;
  }
  (*this->operation_->_vptr_IOperation[1])(this->operation_,local_30);
  std::stack<double,_std::deque<double,_std::allocator<double>_>_>::push
            ((stack<double,_std::deque<double,_std::allocator<double>_>_> *)
             args.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,&local_50);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_30);
  return;
}

Assistant:

void OperatorNode::Act(std::stack<double> &s) const {
  std::vector<double> args{};
  for (int i = 0; i < operation_->GetArity(); i++) {
    // TODO: check stack. If it's empty - throw exception.
    args.push_back(s.top());
    s.pop();
  }
  auto res = operation_->Apply(args);
  s.push(res);
}